

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,string *toFile,mode_t permissions)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  ostringstream e;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  bVar3 = true;
  if (permissions != 0) {
    bVar1 = cmsys::SystemTools::SetPermissions(toFile,permissions,false);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = std::operator<<((ostream *)local_198,this->Name);
      poVar2 = std::operator<<(poVar2," cannot set permissions on \"");
      poVar2 = std::operator<<(poVar2,(string *)toFile);
      std::operator<<(poVar2,"\"");
      this_00 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&sStack_1b8);
      std::__cxx11::string::~string((string *)&sStack_1b8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmFileCopier::SetPermissions(const std::string& toFile,
                                  mode_t permissions)
{
  if (permissions) {
#ifdef WIN32
    if (Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
      // Store the mode in an NTFS alternate stream.
      std::string mode_t_adt_filename = toFile + ":cmake_mode_t";

      // Writing to an NTFS alternate stream changes the modification
      // time, so we need to save and restore its original value.
      cmFileTimes file_time_orig(toFile);
      {
        cmsys::ofstream permissionStream(mode_t_adt_filename.c_str());
        if (permissionStream) {
          permissionStream << std::oct << permissions << std::endl;
        }
        permissionStream.close();
      }
      file_time_orig.Store(toFile);
    }
#endif

    if (!cmSystemTools::SetPermissions(toFile, permissions)) {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }
  return true;
}